

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O2

void __thiscall
RenX_LoggingPlugin::RenX_OnAdminPMessage
          (RenX_LoggingPlugin *this,Server *server,PlayerInfo *player,PlayerInfo *target,
          string_view message)

{
  code *pcVar1;
  string msg;
  undefined8 local_50;
  long local_48;
  
  if ((*(uint *)&this->field_0xa0 >> 0x10 & 1) == 0) {
    pcVar1 = RenX::Server::sendAdmChan;
  }
  else {
    pcVar1 = RenX::Server::sendLogChan;
  }
  std::__cxx11::string::string((string *)&local_50,&this->pAdminMsgFmt);
  if (local_48 != 0) {
    RenX::processTags((string *)&local_50,server,player,target,(BuildingInfo *)0x0);
    RenX::replace_tag(&local_50,*(undefined8 *)(RenX::tags + 0x1510),
                      *(undefined8 *)(RenX::tags + 0x1508),message._M_len,message._M_str);
    (*pcVar1)(server,local_48,local_50);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnAdminPMessage(RenX::Server &server, const RenX::PlayerInfo &player, const RenX::PlayerInfo &target, std::string_view message)
{
	logFuncType func;
	if (RenX_LoggingPlugin::adminPMessagePublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->pAdminMsgFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server, &player, &target);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_MESSAGE_TAG, message);
		(server.*func)(msg);
	}
}